

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v6::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  _func_int **in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  uint local_b8 [34];
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             &stack0xffffffffffffff28,&this->bigits_);
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar11 = (uint)uVar2;
  if ((int)uVar11 < 0) {
    assert_fail((char *)in_stack_ffffffffffffff30,0,(char *)in_stack_ffffffffffffff28);
  }
  uVar3 = (ulong)(uVar11 * 2);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar3) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar3);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar3;
  if (uVar11 == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar4 = 1;
    if (1 < (int)uVar11) {
      uVar4 = uVar2 & 0xffffffff;
    }
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar9 = 0;
    uVar2 = 0;
    uVar3 = 0;
    puVar7 = in_stack_ffffffffffffff30;
    uVar5 = uVar9;
    do {
      do {
        bVar12 = CARRY8(uVar2,(ulong)in_stack_ffffffffffffff30[uVar9] * (ulong)*puVar7);
        uVar2 = uVar2 + (ulong)in_stack_ffffffffffffff30[uVar9] * (ulong)*puVar7;
        uVar3 = uVar3 + bVar12;
        bVar12 = uVar9 != 0;
        uVar9 = uVar9 - 1;
        puVar7 = puVar7 + 1;
      } while (bVar12);
      puVar1[uVar5] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar9 = uVar5 + 1;
      puVar7 = in_stack_ffffffffffffff30;
      uVar5 = uVar9;
    } while (uVar9 != uVar4);
  }
  if ((int)uVar11 < (int)(uVar11 * 2)) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    iVar6 = -uVar11;
    uVar4 = (ulong)(uVar11 & 0x7fffffff);
    uVar8 = 1;
    do {
      if ((int)(((int)uVar4 - uVar11) + 1) < (int)uVar11) {
        puVar7 = in_stack_ffffffffffffff30 + (int)uVar8;
        lVar10 = -1;
        do {
          bVar12 = CARRY8(uVar2,(ulong)in_stack_ffffffffffffff30
                                       [(ulong)(uVar11 & 0x7fffffff) + lVar10] * (ulong)*puVar7);
          uVar2 = uVar2 + (ulong)in_stack_ffffffffffffff30[(ulong)(uVar11 & 0x7fffffff) + lVar10] *
                          (ulong)*puVar7;
          uVar3 = uVar3 + bVar12;
          lVar10 = lVar10 + -1;
          puVar7 = puVar7 + 1;
        } while (iVar6 != (int)lVar10);
      }
      puVar1[uVar4] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar4 = uVar4 + 1;
      iVar6 = iVar6 + 1;
      bVar12 = uVar8 != uVar11;
      uVar8 = uVar8 + 1;
    } while (bVar12);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (in_stack_ffffffffffffff30 != local_b8) {
    operator_delete(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }